

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int c_vsnprintf(char *buf,size_t buf_size,char *fmt,__va_list_tag *ap)

{
  char cVar1;
  uint uVar2;
  int64_t num;
  byte bVar3;
  int *piVar4;
  uint *puVar5;
  byte *pbVar6;
  long *plVar7;
  char *pcVar8;
  ulong *puVar9;
  int64_t *piVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  bool bVar22;
  
  iVar20 = (int)buf_size;
  uVar19 = 0;
LAB_001091ed:
  do {
    bVar3 = *fmt;
    fmt = (char *)((byte *)fmt + 1);
    iVar18 = (int)uVar19;
    if (bVar3 == 0x25) {
      bVar3 = *fmt;
      bVar21 = bVar3 == 0x30;
      iVar17 = 0;
      if ((byte)(bVar3 - 0x30) < 10) {
        iVar17 = 0;
        do {
          iVar17 = (uint)(byte)(bVar3 - 0x30) + iVar17 * 10;
          bVar3 = ((byte *)fmt)[1];
          fmt = (char *)((byte *)fmt + 1);
        } while ((byte)(bVar3 - 0x30) < 10);
      }
      if (bVar3 == 0x2a) {
        uVar13 = ap->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          piVar4 = (int *)((ulong)uVar13 + (long)ap->reg_save_area);
          ap->gp_offset = uVar13 + 8;
        }
        else {
          piVar4 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar4 + 2;
        }
        iVar17 = *piVar4;
        bVar3 = ((byte *)fmt)[1];
        fmt = (char *)((byte *)fmt + 1);
      }
      bVar15 = 0;
      if (bVar3 == 0x2e) {
        bVar3 = ((byte *)fmt)[1];
        if (bVar3 == 0x2a) {
          uVar13 = ap->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar5 = (uint *)((ulong)uVar13 + (long)ap->reg_save_area);
            ap->gp_offset = uVar13 + 8;
          }
          else {
            puVar5 = (uint *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar5 + 2;
          }
          uVar13 = *puVar5;
          bVar3 = ((byte *)fmt)[2];
          fmt = (char *)((byte *)fmt + 2);
        }
        else {
          fmt = (char *)((byte *)fmt + 1);
          if (9 < (byte)(bVar3 - 0x30)) goto LAB_001092d6;
          uVar13 = 0;
          do {
            uVar13 = (uint)(byte)(bVar3 - 0x30) + uVar13 * 10;
            bVar3 = ((byte *)fmt)[1];
            fmt = (char *)((byte *)fmt + 1);
          } while ((byte)(bVar3 - 0x30) < 10);
        }
      }
      else {
LAB_001092d6:
        uVar13 = 0;
      }
      if ((bVar3 - 0x49 < 0x32) && ((0x2090a80000009U >> ((ulong)(bVar3 - 0x49) & 0x3f) & 1) != 0))
      {
        bVar22 = ((byte *)fmt)[1] == 0x68;
        if (bVar22) {
          bVar3 = 0x48;
        }
        pbVar6 = (byte *)fmt + 1;
        if (bVar22) {
          pbVar6 = (byte *)fmt + 2;
        }
        bVar22 = ((byte *)fmt)[(ulong)bVar22 + 1] == 0x6c;
        bVar15 = bVar3;
        if (bVar22) {
          bVar15 = 0x71;
        }
        fmt = (char *)(pbVar6 + bVar22);
        bVar3 = pbVar6[bVar22];
      }
      fmt = (char *)((byte *)fmt + 1);
      if (bVar3 != 99) {
        if (bVar3 == 0x73) {
          uVar2 = ap->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            plVar7 = (long *)((ulong)uVar2 + (long)ap->reg_save_area);
            ap->gp_offset = uVar2 + 8;
          }
          else {
            plVar7 = (long *)ap->overflow_arg_area;
            ap->overflow_arg_area = plVar7 + 1;
          }
          lVar11 = *plVar7;
          uVar19 = 0;
          if ((-1 < (int)uVar13) && (uVar13 != 0)) {
            uVar12 = 0;
            do {
              uVar19 = uVar12;
              if (*(char *)(lVar11 + uVar12) == '\0') break;
              uVar12 = uVar12 + 1;
              uVar19 = (ulong)uVar13;
            } while (uVar13 != uVar12);
          }
          if (0 < iVar17 - (int)uVar19) {
            lVar14 = (long)iVar18;
            iVar16 = 0;
            do {
              if (lVar14 < iVar20) {
                buf[lVar14] = ' ';
              }
              lVar14 = lVar14 + 1;
              iVar16 = iVar16 + -1;
            } while ((int)uVar19 - iVar17 != iVar16);
            iVar18 = iVar18 - iVar16;
          }
          uVar19 = (ulong)iVar18;
          lVar14 = 0;
          do {
            cVar1 = *(char *)(lVar11 + lVar14);
            if (cVar1 == '\0') break;
            if ((long)uVar19 < (long)iVar20) {
              buf[uVar19] = cVar1;
            }
            uVar19 = uVar19 + 1;
            lVar14 = lVar14 + 1;
          } while ((int)lVar14 < (int)uVar13 || (int)uVar13 < 1);
          goto LAB_001091ed;
        }
        if ((bVar3 == 100) && (bVar15 == 0)) {
          uVar13 = ap->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            piVar4 = (int *)((ulong)uVar13 + (long)ap->reg_save_area);
            ap->gp_offset = uVar13 + 8;
          }
          else {
            piVar4 = (int *)ap->overflow_arg_area;
            ap->overflow_arg_area = piVar4 + 2;
          }
          uVar19 = (ulong)*piVar4;
LAB_001094ec:
          iVar16 = 10;
        }
        else {
          if (((bVar3 == 100) && (bVar15 == 0x6c)) || ((bVar3 == 100 && (bVar15 == 0x71)))) {
            uVar13 = ap->gp_offset;
            if ((ulong)uVar13 < 0x29) {
              puVar9 = (ulong *)((ulong)uVar13 + (long)ap->reg_save_area);
              ap->gp_offset = uVar13 + 8;
            }
            else {
              puVar9 = (ulong *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar9 + 1;
            }
            uVar19 = *puVar9;
            goto LAB_001094ec;
          }
          if ((bVar3 != 0x75 && bVar3 != 0x78) || (bVar15 != 0)) {
            if (bVar3 != 0x75 && bVar3 != 0x78 || bVar15 != 0x6c) {
              if (bVar3 != 0x70) {
                abort();
              }
              uVar13 = ap->gp_offset;
              if ((ulong)uVar13 < 0x29) {
                piVar10 = (int64_t *)((ulong)uVar13 + (long)ap->reg_save_area);
                ap->gp_offset = uVar13 + 8;
              }
              else {
                piVar10 = (int64_t *)ap->overflow_arg_area;
                ap->overflow_arg_area = piVar10 + 1;
              }
              num = *piVar10;
              if (iVar18 < iVar20) {
                buf[iVar18] = '0';
              }
              lVar11 = (long)iVar18;
              if ((int)(lVar11 + 1) < iVar20) {
                buf[lVar11 + 1] = 'x';
              }
              iVar17 = c_itoa(buf + lVar11 + 2,buf_size - (lVar11 + 2),num,0x10,(uint)bVar21,0);
              uVar19 = (ulong)(iVar18 + iVar17 + 2);
              goto LAB_001091ed;
            }
            uVar13 = ap->gp_offset;
            if ((ulong)uVar13 < 0x29) {
              puVar9 = (ulong *)((ulong)uVar13 + (long)ap->reg_save_area);
              ap->gp_offset = uVar13 + 8;
            }
            else {
              puVar9 = (ulong *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar9 + 1;
            }
            uVar19 = *puVar9;
          }
          else {
            uVar13 = ap->gp_offset;
            if ((ulong)uVar13 < 0x29) {
              puVar5 = (uint *)((ulong)uVar13 + (long)ap->reg_save_area);
              ap->gp_offset = uVar13 + 8;
            }
            else {
              puVar5 = (uint *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar5 + 2;
            }
            uVar19 = (ulong)*puVar5;
          }
          iVar16 = 10;
          if (bVar3 == 0x78) {
            iVar16 = 0x10;
          }
        }
        iVar17 = c_itoa(buf + iVar18,buf_size - (long)iVar18,uVar19,iVar16,(uint)bVar21,iVar17);
        uVar19 = (ulong)(uint)(iVar18 + iVar17);
        goto LAB_001091ed;
      }
      uVar13 = ap->gp_offset;
      if ((ulong)uVar13 < 0x29) {
        pcVar8 = (char *)((ulong)uVar13 + (long)ap->reg_save_area);
        ap->gp_offset = uVar13 + 8;
      }
      else {
        pcVar8 = (char *)ap->overflow_arg_area;
        ap->overflow_arg_area = pcVar8 + 8;
      }
      if (iVar18 < iVar20) {
        buf[iVar18] = *pcVar8;
      }
    }
    else {
      if (bVar3 == 0) {
        if (buf_size != 0) {
          iVar17 = iVar20 + -1;
          if (iVar18 < iVar20) {
            iVar17 = iVar18;
          }
          buf[iVar17] = '\0';
        }
        return iVar18;
      }
      if (iVar18 < iVar20) {
        buf[iVar18] = bVar3;
      }
    }
    uVar19 = (ulong)(iVar18 + 1);
  } while( true );
}

Assistant:

int c_vsnprintf(char *buf, size_t buf_size, const char *fmt, va_list ap) {
    int ch, i = 0, len_mod, flags, precision, field_width;

    while ((ch = *fmt++) != '\0') {
        if (ch != '%') {
            C_SNPRINTF_APPEND_CHAR(ch);
        } else {
            /*
       * Conversion specification:
       *   zero or more flags (one of: # 0 - <space> + ')
       *   an optional minimum  field  width (digits)
       *   an  optional precision (. followed by digits, or *)
       *   an optional length modifier (one of: hh h l ll L q j z t)
       *   conversion specifier (one of: d i o u x X e E f F g G a A c s p n)
       */
            flags = field_width = precision = len_mod = 0;

            /* Flags. only zero-pad flag is supported. */
            if (*fmt == '0') {
                flags |= C_SNPRINTF_FLAG_ZERO;
            }

            /* Field width */
            while (*fmt >= '0' && *fmt <= '9') {
                field_width *= 10;
                field_width += *fmt++ - '0';
            }
            /* Dynamic field width */
            if (*fmt == '*') {
                field_width = va_arg(ap, int);
                fmt++;
            }

            /* Precision */
            if (*fmt == '.') {
                fmt++;
                if (*fmt == '*') {
                    precision = va_arg(ap, int);
                    fmt++;
                } else {
                    while (*fmt >= '0' && *fmt <= '9') {
                        precision *= 10;
                        precision += *fmt++ - '0';
                    }
                }
            }

            /* Length modifier */
            switch (*fmt) {
                case 'h':
                case 'l':
                case 'L':
                case 'I':
                case 'q':
                case 'j':
                case 'z':
                case 't':
                    len_mod = *fmt++;
                    if (*fmt == 'h') {
                        len_mod = 'H';
                        fmt++;
                    }
                    if (*fmt == 'l') {
                        len_mod = 'q';
                        fmt++;
                    }
                    break;
            }

            ch = *fmt++;
            if (ch == 's') {
                const char *s = va_arg(ap, const char *); /* Always fetch parameter */
                int j;
                int pad = field_width - (precision >= 0 ? strnlen(s, precision) : 0);
                for (j = 0; j < pad; j++) {
                    C_SNPRINTF_APPEND_CHAR(' ');
                }

                /* Ignore negative and 0 precisions */
                for (j = 0; (precision <= 0 || j < precision) && s[j] != '\0'; j++) {
                    C_SNPRINTF_APPEND_CHAR(s[j]);
                }
            } else if (ch == 'c') {
                ch = va_arg(ap, int); /* Always fetch parameter */
                C_SNPRINTF_APPEND_CHAR(ch);
            } else if (ch == 'd' && len_mod == 0) {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, int), 10, flags,
                            field_width);
            } else if (ch == 'd' && len_mod == 'l') {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, long), 10, flags,
                            field_width);
            } else if (ch == 'd' && len_mod == 'q') {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, int64_t), 10, flags,
                            field_width);
            } else if ((ch == 'x' || ch == 'u') && len_mod == 0) {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, unsigned),
                            ch == 'x' ? 16 : 10, flags, field_width);
            } else if ((ch == 'x' || ch == 'u') && len_mod == 'l') {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, unsigned long),
                            ch == 'x' ? 16 : 10, flags, field_width);
            } else if (ch == 'p') {
                unsigned long num = (unsigned long) va_arg(ap, void *);
                C_SNPRINTF_APPEND_CHAR('0');
                C_SNPRINTF_APPEND_CHAR('x');
                i += c_itoa(buf + i, buf_size - i, num, 16, flags, 0);
            } else {
#ifndef NO_LIBC
                /*
         * TODO(lsm): abort is not nice in a library, remove it
         * Also, ESP8266 SDK doesn't have it
         */
                abort();
#endif
            }
        }
    }

    /* Zero-terminate the result */
    if (buf_size > 0) {
        buf[i < (int) buf_size ? i : (int) buf_size - 1] = '\0';
    }

    return i;
}